

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O2

Slice * __thiscall Imf_3_4::FrameBuffer::findSlice(FrameBuffer *this,char *name)

{
  const_iterator cVar1;
  Slice *pSVar2;
  Name local_110;
  
  Name::Name(&local_110,name);
  cVar1 = std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  *)this,&local_110);
  pSVar2 = (Slice *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Slice *)(cVar1._M_node + 9);
  }
  return pSVar2;
}

Assistant:

const Slice*
FrameBuffer::findSlice (const char name[]) const
{
    SliceMap::const_iterator i = _map.find (name);
    return (i == _map.end ()) ? 0 : &i->second;
}